

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O3

void ylt::metric::detail::process_status(void)

{
  element_type *peVar1;
  int iVar2;
  atomic<long> *paVar3;
  string *psVar4;
  ProcStat stat;
  shared_ptr<_IO_FILE> stream_file;
  
  if (process_status()::process_uptime == '\0') {
    iVar2 = __cxa_guard_acquire(&process_status()::process_uptime);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      stat._0_8_ = &stat.session;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stat,"ylt_process_uptime","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_counter<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &process_status::process_uptime,psVar4);
      if ((int *)stat._0_8_ != &stat.session) {
        operator_delete((void *)stat._0_8_,stat._16_8_ + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>
                   ::~__shared_ptr,&process_status::process_uptime,&__dso_handle);
      __cxa_guard_release(&process_status()::process_uptime);
    }
  }
  if (process_status()::process_priority == '\0') {
    iVar2 = __cxa_guard_acquire(&process_status()::process_priority);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      stat._0_8_ = &stat.session;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stat,"ylt_process_priority","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &process_status::process_priority,psVar4);
      if ((int *)stat._0_8_ != &stat.session) {
        operator_delete((void *)stat._0_8_,stat._16_8_ + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::process_priority,&__dso_handle);
      __cxa_guard_release(&process_status()::process_priority);
    }
  }
  if (process_status()::pid == '\0') {
    iVar2 = __cxa_guard_acquire(&process_status()::pid);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      stat._0_8_ = &stat.session;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stat,"ylt_pid","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&process_status::pid,psVar4
                );
      if ((int *)stat._0_8_ != &stat.session) {
        operator_delete((void *)stat._0_8_,stat._16_8_ + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::pid,&__dso_handle);
      __cxa_guard_release(&process_status()::pid);
    }
  }
  if (process_status()::ppid == '\0') {
    iVar2 = __cxa_guard_acquire(&process_status()::ppid);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      stat._0_8_ = &stat.session;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stat,"ylt_ppid","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&process_status::ppid,
                 psVar4);
      if ((int *)stat._0_8_ != &stat.session) {
        operator_delete((void *)stat._0_8_,stat._16_8_ + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::ppid,&__dso_handle);
      __cxa_guard_release(&process_status()::ppid);
    }
  }
  if (process_status()::pgrp == '\0') {
    iVar2 = __cxa_guard_acquire(&process_status()::pgrp);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      stat._0_8_ = &stat.session;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stat,"ylt_pgrp","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)&process_status::pgrp,
                 psVar4);
      if ((int *)stat._0_8_ != &stat.session) {
        operator_delete((void *)stat._0_8_,stat._16_8_ + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::pgrp,&__dso_handle);
      __cxa_guard_release(&process_status()::pgrp);
    }
  }
  if (process_status()::thread_count == '\0') {
    iVar2 = __cxa_guard_acquire(&process_status()::thread_count);
    if (iVar2 != 0) {
      psVar4 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      stat._0_8_ = &stat.session;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stat,"ylt_thread_count","");
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &process_status::thread_count,psVar4);
      if ((int *)stat._0_8_ != &stat.session) {
        operator_delete((void *)stat._0_8_,stat._16_8_ + 1);
      }
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&process_status::thread_count,&__dso_handle);
      __cxa_guard_release(&process_status()::thread_count);
    }
  }
  stat.priority = 0;
  stat.nice = 0;
  stat.cutime = 0;
  stat.cstime = 0;
  stat.utime = 0;
  stat.stime = 0;
  stat.majflt = 0;
  stat.cmajflt = 0;
  stat.minflt = 0;
  stat.cminflt = 0;
  stat.session = 0;
  stat.tty_nr = 0;
  stat.tpgid = 0;
  stat.flags = 0;
  stat.pid = 0;
  stat.state = '\0';
  stat._5_3_ = 0;
  stat.ppid = 0;
  stat.pgrp = 0;
  stat.num_threads = 0;
  stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fopen("/proc/self/stat","r");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<_IO_FILE*,ylt::metric::detail::process_status()::_lambda(_IO_FILE*)_1_,std::allocator<void>,void>
            (&stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar2 = __isoc99_fscanf(stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,
                            "%d %*s %c %d %d %d %d %d %u %lu %lu %lu %lu %lu %lu %lu %lu %ld %ld %ld"
                            ,&stat,&stat.state,&stat.ppid,&stat.pgrp,&stat.session,&stat.tty_nr,
                            &stat.tpgid,&stat.flags,&stat.minflt,&stat.cminflt,&stat.majflt,
                            &stat.cmajflt,&stat.utime,&stat.stime,&stat.cutime,&stat.cstime,
                            &stat.priority,&stat.nice,&stat.num_threads);
    if (iVar2 == 0x13) {
      paVar3 = thread_local_value<long>::local_value
                         (&(process_status::process_uptime.
                            super___shared_ptr<ylt::metric::basic_static_counter<long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->default_label_value_);
      LOCK();
      (paVar3->super___atomic_base<long>)._M_i = (paVar3->super___atomic_base<long>)._M_i + 1;
      peVar1 = process_status::process_priority.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      UNLOCK();
      if (((process_status::process_priority.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((process_status::process_priority.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,stat.priority);
      peVar1 = process_status::pid.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((process_status::pid.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((process_status::pid.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,(long)stat.pid);
      peVar1 = process_status::ppid.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((process_status::ppid.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((process_status::ppid.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,(long)stat.ppid);
      peVar1 = process_status::pgrp.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((process_status::pgrp.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((process_status::pgrp.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,(long)stat.pgrp);
      peVar1 = process_status::thread_count.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((process_status::thread_count.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_basic_static_counter<long>).has_change_ == false) {
        ((process_status::thread_count.
          super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_basic_static_counter<long>).has_change_ = true;
      }
      thread_local_value<long>::update
                (&(peVar1->super_basic_static_counter<long>).default_label_value_,stat.num_threads);
    }
  }
  if (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (stream_file.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

inline void process_status() {
  static auto process_uptime =
      system_metric_manager::instance().get_metric_static<counter_t>(
          "ylt_process_uptime");
  static auto process_priority =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_priority");
  static auto pid =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_pid");
  static auto ppid =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_ppid");
  static auto pgrp =
      system_metric_manager::instance().get_metric_static<gauge_t>("ylt_pgrp");
  static auto thread_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_thread_count");

  ProcStat stat{};
#if defined(__linux__)
  auto stream_file =
      std::shared_ptr<FILE>(fopen("/proc/self/stat", "r"), [](FILE* ptr) {
        fclose(ptr);
      });
  if (stream_file == nullptr) {
    return;
  }

  if (fscanf(stream_file.get(),
             "%d %*s %c "
             "%d %d %d %d %d "
             "%u %lu %lu %lu "
             "%lu %lu %lu %lu %lu "
             "%ld %ld %ld",
             &stat.pid, &stat.state, &stat.ppid, &stat.pgrp, &stat.session,
             &stat.tty_nr, &stat.tpgid, &stat.flags, &stat.minflt,
             &stat.cminflt, &stat.majflt, &stat.cmajflt, &stat.utime,
             &stat.stime, &stat.cutime, &stat.cstime, &stat.priority,
             &stat.nice, &stat.num_threads) != 19) {
    return;
  }
#elif defined(__APPLE__)
  static pid_t proc_id = getpid();
  std::ostringstream oss;
  char cmdbuf[128];
  snprintf(cmdbuf, sizeof(cmdbuf),
           "ps -p %ld -o pid,ppid,pgid,sess"
           ",tpgid,flags,pri,nice | tail -n1",
           (long)proc_id);
  if (read_command_output_through_popen(oss, cmdbuf) != 0) {
    return;
  }
  const std::string &result = oss.str();
  if (sscanf(result.c_str(),
             "%d %d %d %d"
             "%d %u %ld %ld",
             &stat.pid, &stat.ppid, &stat.pgrp, &stat.session, &stat.tpgid,
             &stat.flags, &stat.priority, &stat.nice) != 8) {
    return;
  }
#endif
  process_uptime->inc();
  process_priority->update(stat.priority);
  pid->update(stat.pid);
  ppid->update(stat.ppid);
  pgrp->update(stat.pgrp);
  thread_count->update(stat.num_threads);
}